

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
asl::Array<asl::Map<asl::String,_int>::KeyVal>::alloc
          (Array<asl::Map<asl::String,_int>::KeyVal> *this,int m)

{
  int *piVar1;
  undefined8 *puVar2;
  KeyVal *pKVar3;
  ulong uVar4;
  
  uVar4 = 3;
  if (3 < m) {
    uVar4 = (ulong)(uint)m;
  }
  piVar1 = (int *)malloc(uVar4 << 5 | 0x10);
  if (piVar1 != (int *)0x0) {
    pKVar3 = (KeyVal *)(piVar1 + 4);
    this->_a = pKVar3;
    piVar1[1] = (int)uVar4;
    *piVar1 = m;
    piVar1[2] = 1;
    if (m != 0) {
      do {
        (pKVar3->key).field_2._space[0] = '\0';
        (pKVar3->key)._size = 0;
        (pKVar3->key)._len = 0;
        pKVar3->value = 0;
        pKVar3 = pKVar3 + 1;
      } while (pKVar3 != (KeyVal *)(piVar1 + (long)m * 8 + 4));
    }
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = dup2;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void Array<T>::alloc(int m)
{
	int s=max(m, 3);
	char* p = (char*) malloc( s*sizeof(T)+sizeof(Data) );
	if(!p)
		ASL_BAD_ALLOC();
	_a = (T*) ( p + sizeof(Data) );
	ASL_RC_INIT();
	d().s = s;
	d().n = m;
	d().rc=1;
	asl_construct(_a, m);
}